

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::ComputeEigenvector1
          (TPZTensor<double> *this,TPZManVector<double,_3> *eigenvector0,double *eigenvalue1,
          TPZManVector<double,_3> *eigenvector1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 uVar4;
  bool bVar5;
  double *pdVar6;
  TPZVec<double> *x;
  double *in_RDX;
  TPZVec<double> *in_RSI;
  double dVar7;
  TPZManVector<double,_3> *this_00;
  TPZManVector<double,_3> *copy;
  REAL maxAbsComp;
  REAL absM11;
  REAL absM01;
  REAL absM00;
  double m11;
  double m01;
  double m00;
  TPZManVector<double,_3> AV;
  TPZManVector<double,_3> AU;
  double invLength;
  TPZManVector<double,_3> V;
  TPZManVector<double,_3> U;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  TPZManVector<double,_3> *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  TPZVec<double> *in_stack_fffffffffffffa10;
  int64_t in_stack_fffffffffffffa18;
  TPZManVector<double,_3> *in_stack_fffffffffffffa20;
  TPZVec<double> *in_stack_fffffffffffffa50;
  double dVar8;
  TPZVec<double> *in_stack_fffffffffffffa58;
  TPZVec<double> *in_stack_fffffffffffffa60;
  double dVar9;
  double local_148;
  REAL local_140;
  REAL local_138;
  double local_130;
  double local_128;
  double local_120;
  TPZVec<double> local_118;
  TPZVec<double> local_e0;
  double local_a8;
  TPZVec<double> local_90;
  TPZVec<double> local_58 [2];
  double *local_18;
  TPZVec<double> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  pdVar6 = TPZVec<double>::operator[](local_10,0);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_10,1);
  if (ABS(dVar7) <= ABS(*pdVar6)) {
    pdVar6 = TPZVec<double>::operator[](local_10,1);
    dVar7 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,1);
    dVar9 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    dVar8 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    local_a8 = sqrt(dVar7 * dVar9 + dVar8 * *pdVar6);
    local_a8 = 1.0 / local_a8;
    pdVar6 = TPZVec<double>::operator[](local_58,0);
    *pdVar6 = 0.0;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    dVar7 = *pdVar6 * local_a8;
    pdVar6 = TPZVec<double>::operator[](local_58,1);
    *pdVar6 = dVar7;
    pdVar6 = TPZVec<double>::operator[](local_10,1);
    dVar7 = -*pdVar6 * local_a8;
    pdVar6 = TPZVec<double>::operator[](local_58,2);
    *pdVar6 = dVar7;
  }
  else {
    pdVar6 = TPZVec<double>::operator[](local_10,0);
    dVar7 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,0);
    dVar9 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    dVar8 = *pdVar6;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    local_a8 = sqrt(dVar7 * dVar9 + dVar8 * *pdVar6);
    local_a8 = 1.0 / local_a8;
    pdVar6 = TPZVec<double>::operator[](local_10,2);
    dVar7 = -*pdVar6 * local_a8;
    pdVar6 = TPZVec<double>::operator[](local_58,0);
    *pdVar6 = dVar7;
    pdVar6 = TPZVec<double>::operator[](local_58,1);
    *pdVar6 = 0.0;
    pdVar6 = TPZVec<double>::operator[](local_10,0);
    dVar7 = *pdVar6 * local_a8;
    pdVar6 = TPZVec<double>::operator[](local_58,2);
    *pdVar6 = dVar7;
  }
  Cross<double>(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  pdVar6 = XX((TPZTensor<double> *)0x14acae1);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,0);
  dVar9 = *pdVar6;
  pdVar6 = XY((TPZTensor<double> *)0x14acb3d);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,1);
  dVar1 = *pdVar6;
  pdVar6 = XZ((TPZTensor<double> *)0x14acbc1);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,0);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = XY((TPZTensor<double> *)0x14acc68);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,0);
  dVar9 = *pdVar6;
  pdVar6 = YY((TPZTensor<double> *)0x14accc4);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,1);
  dVar1 = *pdVar6;
  pdVar6 = YZ((TPZTensor<double> *)0x14acd48);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,1);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = XZ((TPZTensor<double> *)0x14acdf0);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,0);
  dVar9 = *pdVar6;
  pdVar6 = YZ((TPZTensor<double> *)0x14ace4c);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,1);
  dVar1 = *pdVar6;
  pdVar6 = ZZ((TPZTensor<double> *)0x14aced0);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,2);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  pdVar6 = XX((TPZTensor<double> *)0x14acf8c);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,0);
  dVar9 = *pdVar6;
  pdVar6 = XY((TPZTensor<double> *)0x14acfe8);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,1);
  dVar1 = *pdVar6;
  pdVar6 = XZ((TPZTensor<double> *)0x14ad06c);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,0);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = XY((TPZTensor<double> *)0x14ad113);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,0);
  dVar9 = *pdVar6;
  pdVar6 = YY((TPZTensor<double> *)0x14ad16f);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,1);
  dVar1 = *pdVar6;
  pdVar6 = YZ((TPZTensor<double> *)0x14ad1f3);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,1);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = XZ((TPZTensor<double> *)0x14ad29b);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,0);
  dVar9 = *pdVar6;
  pdVar6 = YZ((TPZTensor<double> *)0x14ad2f7);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,1);
  dVar1 = *pdVar6;
  pdVar6 = ZZ((TPZTensor<double> *)0x14ad37b);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,2);
  dVar3 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,2);
  *pdVar6 = dVar2 * dVar3 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = TPZVec<double>::operator[](local_58,0);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,0);
  dVar9 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,1);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,1);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,2);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_e0,2);
  local_120 = (dVar2 * *pdVar6 + dVar7 * dVar9 + dVar8 * dVar1) - *local_18;
  pdVar6 = TPZVec<double>::operator[](local_58,0);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,0);
  dVar9 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,1);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,1);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](local_58,2);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,2);
  local_128 = dVar2 * *pdVar6 + dVar7 * dVar9 + dVar8 * dVar1;
  pdVar6 = TPZVec<double>::operator[](&local_90,0);
  dVar7 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,0);
  dVar9 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,1);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,1);
  dVar1 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_90,2);
  dVar2 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](&local_118,2);
  local_130 = (dVar2 * *pdVar6 + dVar7 * dVar9 + dVar8 * dVar1) - *local_18;
  local_138 = TPZExtractVal::val(local_120);
  local_138 = ABS(local_138);
  this_00 = (TPZManVector<double,_3> *)TPZExtractVal::val(local_128);
  local_140 = ABS((double)this_00);
  copy = (TPZManVector<double,_3> *)TPZExtractVal::val(local_130);
  local_148 = ABS((double)copy);
  if (local_138 < local_148) {
    in_stack_fffffffffffffa00 = (TPZManVector<double,_3> *)std::max<double>(&local_148,&local_140);
    bVar5 = IsZeroVal((double *)in_stack_fffffffffffffa00,
                      (double)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    if (bVar5) {
      TPZManVector<double,_3>::operator=(this_00,copy);
    }
    else {
      if (local_148 < local_140) {
        local_130 = local_130 / local_128;
        local_128 = sqrt(local_130 * local_130 + 1.0);
        local_128 = 1.0 / local_128;
        local_130 = local_128 * local_130;
      }
      else {
        local_128 = local_128 / local_130;
        local_130 = sqrt(local_128 * local_128 + 1.0);
        local_130 = 1.0 / local_130;
        local_128 = local_130 * local_128;
      }
      sscal<double,double>
                (in_stack_fffffffffffffa10,
                 (double)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
      TPZManVector<double,_3>::operator=(this_00,copy);
      saxpy<double,double,double>
                (&this_00->super_TPZVec<double>,&copy->super_TPZVec<double>,
                 (double)in_stack_fffffffffffffa10);
    }
  }
  else {
    x = (TPZVec<double> *)std::max<double>(&local_138,&local_140);
    uVar4 = IsZeroVal((double *)in_stack_fffffffffffffa00,
                      (double)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
    if ((bool)uVar4) {
      TPZManVector<double,_3>::operator=(this_00,copy);
    }
    else {
      if (local_138 < local_140) {
        local_120 = local_120 / local_128;
        local_128 = sqrt(local_120 * local_120 + 1.0);
        local_128 = 1.0 / local_128;
        local_120 = local_128 * local_120;
      }
      else {
        local_128 = local_128 / local_120;
        local_120 = sqrt(local_128 * local_128 + 1.0);
        local_120 = 1.0 / local_120;
        local_128 = local_120 * local_128;
      }
      sscal<double,double>(x,(double)CONCAT17(uVar4,in_stack_fffffffffffffa08));
      TPZManVector<double,_3>::operator=(this_00,copy);
      saxpy<double,double,double>
                (&this_00->super_TPZVec<double>,&copy->super_TPZVec<double>,(double)x);
    }
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffa00);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffa00);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffa00);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffa00);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvector1(const TPZManVector<T, 3> &eigenvector0, const T &eigenvalue1, TPZManVector<T, 3> &eigenvector1) const {
    // Robustly compute a right-handed orthonormal set { U, V, evec0 }.
    TPZManVector<T, 3> U(3), V(3);

    // The vector eigenvector0 is guaranteed to be unit-length, in which case there is no
    // need to worry about a division by zero when computing invLength.
    T invLength;
    if (fabs(eigenvector0[0]) > fabs(eigenvector0[1])) {
        // The component of maximum absolute value is either eigenvector0[0] or eigenvector0[2].
        invLength = (T) 1 / sqrt(eigenvector0[0] * eigenvector0[0] + eigenvector0[2] * eigenvector0[2]);
        U[0] = -eigenvector0[2] * invLength;
        U[1] = T(0.);
        U[2] = +eigenvector0[0] * invLength;
    } else {
        // The component of maximum absolute value is either eigenvector0[1] or eigenvector0[2].
        invLength = (T) 1 / sqrt(eigenvector0[1] * eigenvector0[1] + eigenvector0[2] * eigenvector0[2]);
        U[0] = T(0.);
        U[1] = +eigenvector0[2] * invLength;
        U[2] = -eigenvector0[1] * invLength;
    }
    Cross(eigenvector0, U, V);

    // Let e be eigenvalue1 and let v1 be a corresponding eigenvector which is a
    // solution to the linear system (A - e*I)*v1 = 0.  The matrix (A - e*I)
    // is 3x3, not invertible (so infinitely many solutions), and has rank 2
    // when eigenvalue1 and eigenvalue2 are different.  It has rank 1 when eigenvalue1 and eigenvalue2
    // are equal.  Numerically, it is difficult to compute robustly the rank
    // of a matrix.  Instead, the 3x3 linear system is reduced to a 2x2 system
    // as follows.  Define the 3x2 matrix J = [U V] whose columns are the U
    // and V computed previously.  Define the 2x1 vector X = J*v1.  The 2x2
    // system is 0 = M * X = (J^T * (A - e*I) * J) * X where J^T is the
    // transpose of J and M = J^T * (A - e*I) * J is a 2x2 matrix.  The system
    // may be written as
    //     +-                        -++-  -+       +-  -+
    //     | U^T*A*U - e  U^T*A*V     || x0 | = e * | x0 |
    //     | V^T*A*U      V^T*A*V - e || x1 |       | x1 |
    //     +-                        -++   -+       +-  -+
    // where X has row entries x0 and x1.
    TPZManVector<T, 3> AU(3);
    AU[0] = XX() * U[0] + XY() * U[1] + XZ() * U[2];
    AU[1] = XY() * U[0] + YY() * U[1] + YZ() * U[2];
    AU[2] = XZ() * U[0] + YZ() * U[1] + ZZ() * U[2];

    TPZManVector<T, 3> AV(3);
    AV[0] = XX() * V[0] + XY() * V[1] + XZ() * V[2];
    AV[1] = XY() * V[0] + YY() * V[1] + YZ() * V[2];
    AV[2] = XZ() * V[0] + YZ() * V[1] + ZZ() * V[2];

    T m00 = U[0] * AU[0] + U[1] * AU[1] + U[2] * AU[2] - eigenvalue1;
    T m01 = U[0] * AV[0] + U[1] * AV[1] + U[2] * AV[2];
    T m11 = V[0] * AV[0] + V[1] * AV[1] + V[2] * AV[2] - eigenvalue1;

    // For robustness, choose the largest-length row of M to compute the
    // eigenvector.  The 2-tuple of coefficients of U and V in the
    // assignments to eigenvector[1] lies on a circle, and U and V are
    // unit length and perpendicular, so eigenvector[1] is unit length
    // (within numerical tolerance).
    REAL absM00 = fabs(TPZExtractVal::val(m00));
    REAL absM01 = fabs(TPZExtractVal::val(m01));
    REAL absM11 = fabs(TPZExtractVal::val(m11));
    REAL maxAbsComp;
    if (absM00 >= absM11) {
        maxAbsComp = std::max(absM00, absM01);
        if (IsZeroVal(maxAbsComp)) {
            eigenvector1 = U;
        } else {
            if (absM00 >= absM01) {
                m01 /= m00;
                m00 = T(1.) / sqrt(T(1.) + m01 * m01);
                m01 *= m00;
            } else {
                m00 /= m01;
                m01 = T(1.) / sqrt(T(1.) + m00 * m00);
                m00 *= m01;
            }
            //eigenvector1 = m01*U - m00*V
            sscal(U, m01);
            eigenvector1 = U;
            saxpy(eigenvector1, V, -m00);
        }
    } else {
        maxAbsComp = std::max(absM11, absM01);
        if (IsZeroVal(maxAbsComp)) {
            eigenvector1 = U;
        } else {
            if (absM11 >= absM01) {
                m01 /= m11;
                m11 = T(1.) / sqrt(T(1.) + m01 * m01);
                m01 *= m11;
            } else {
                m11 /= m01;
                m01 = T(1.) / sqrt(T(1.) + m11 * m11);
                m11 *= m01;
            }
            //eigenvector1 = m11*U - m01*V
            sscal(U, m11);
            eigenvector1 = U;
            saxpy(eigenvector1, V, -m01);
        }
    }
}